

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

void __thiscall kj::Path::evalPart(Path *this,Vector<kj::String> *parts,ArrayPtr<const_char> part)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  char *size;
  Fault __s;
  Fault f;
  Exception *pEStack_60;
  Fault f_1;
  Array<char> local_48;
  Array<char> local_30;
  
  size = part.ptr;
  if (size != (char *)0x0) {
    if (size == (char *)0x2) {
      if ((*(char *)&(parts->builder).ptr == '.') &&
         (*(char *)((long)&(parts->builder).ptr + 1) == '.')) {
        if ((String *)(this->parts).size_ == (this->parts).ptr) {
          kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x13b,FAILED,"parts.size() > 0",
                     "\"can\'t use \\\"..\\\" to break out of starting directory\"",
                     (char (*) [50])"can\'t use \"..\" to break out of starting directory");
          kj::_::Debug::Fault::~Fault(&f);
          return;
        }
        ArrayBuilder<kj::String>::removeLast((ArrayBuilder<kj::String> *)this);
        return;
      }
    }
    else if ((size == (char *)0x1) && (*(char *)&(parts->builder).ptr == '.')) {
      return;
    }
    heapString((String *)&f,(char *)parts,(size_t)size);
    __s.exception = pEStack_60;
    if (pEStack_60 != (Exception *)0x0) {
      __s = f;
    }
    puVar1 = (undefined1 *)strlen((char *)__s.exception);
    puVar2 = (undefined1 *)0x0;
    if (pEStack_60 != (Exception *)0x0) {
      puVar2 = &pEStack_60[-1].field_0x157;
    }
    if (puVar1 != puVar2) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32],kj::String&>
                (&f_1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x142,FAILED,"strlen(str.begin()) == str.size()",
                 "\"NUL character in path component\", str",
                 (char (*) [32])"NUL character in path component",(String *)&f);
      local_30.ptr = (char *)f.exception;
      f.exception = (Exception *)0x0;
      stripNul((String *)&local_48,(String *)&local_30);
      Array<char>::operator=((Array<char> *)&f,&local_48);
      Array<char>::~Array(&local_48);
      Array<char>::~Array(&local_30);
      kj::_::Debug::Fault::~Fault(&f_1);
    }
    Vector<kj::String>::add<kj::String>((Vector<kj::String> *)this,(String *)&f);
    Array<char>::~Array((Array<char> *)&f);
  }
  return;
}

Assistant:

void Path::evalPart(Vector<String>& parts, ArrayPtr<const char> part) {
  if (part.size() == 0) {
    // Ignore consecutive or trailing '/'s.
  } else if (part.size() == 1 && part[0] == '.') {
    // Refers to current directory; ignore.
  } else if (part.size() == 2 && part[0] == '.' && part [1] == '.') {
    KJ_REQUIRE(parts.size() > 0, "can't use \"..\" to break out of starting directory") {
      // When exceptions are disabled, ignore.
      return;
    }
    parts.removeLast();
  } else {
    auto str = heapString(part);
    KJ_REQUIRE(strlen(str.begin()) == str.size(), "NUL character in path component", str) {
      // When exceptions are disabled, strip out '\0' chars.
      str = stripNul(kj::mv(str));
      break;
    }
    parts.add(kj::mv(str));
  }
}